

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  UnitTestImpl *this_00;
  DeathTestImpl *in_RDI;
  int gtest_retval_1;
  int gtest_retval;
  pid_t child_pid;
  int pipe_fd [2];
  size_t thread_count;
  undefined1 in_stack_fffffffffffffb2f;
  TestEventListeners *in_stack_fffffffffffffb30;
  char *__rhs;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  undefined1 uVar4;
  string *in_stack_fffffffffffffb40;
  string *message;
  int *in_stack_fffffffffffffb58;
  allocator<char> *streamable;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb70;
  size_t in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb9c;
  char *in_stack_fffffffffffffba0;
  GTestLogSeverity in_stack_fffffffffffffbac;
  GTestLog *in_stack_fffffffffffffbb0;
  string local_341 [7];
  int local_260;
  undefined4 local_25c;
  int local_170;
  allocator<char> local_169;
  string local_168 [36];
  undefined4 local_144;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_119 [6];
  int local_58;
  int local_54;
  string local_50 [52];
  size_t local_18;
  undefined4 local_4;
  
  local_18 = GetThreadCount();
  if (local_18 != 1) {
    in_stack_fffffffffffffb68 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xffffffffffffffe4;
    GTestLog::GTestLog(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,in_stack_fffffffffffffba0
                       ,in_stack_fffffffffffffb9c);
    in_stack_fffffffffffffb70 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         GTestLog::GetStream((GTestLog *)in_stack_fffffffffffffb68);
    DeathTestThreadWarning_abi_cxx11_(in_stack_fffffffffffffb88);
    std::operator<<((ostream *)in_stack_fffffffffffffb70,local_50);
    std::__cxx11::string::~string(local_50);
    GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffb30);
  }
  do {
    iVar2 = pipe(&local_58);
    bVar1 = IsTrue(iVar2 != -1);
    if (!bVar1) {
      __rhs_00 = local_119;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68,
                 (allocator<char> *)__rhs_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                     (char *)in_stack_fffffffffffffb30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                     (char *)in_stack_fffffffffffffb30);
      local_144 = 0x454;
      StreamableToString<int>(in_stack_fffffffffffffb58);
      std::operator+(in_stack_fffffffffffffb68,__rhs_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                     (char *)in_stack_fffffffffffffb30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                     (char *)in_stack_fffffffffffffb30);
      DeathTestAbort(in_stack_fffffffffffffb40);
    }
    bVar1 = AlwaysFalse();
  } while (bVar1);
  streamable = &local_169;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68,
             (allocator<char> *)in_stack_fffffffffffffb60);
  DeathTest::set_last_death_test_message((string *)0x1d5729);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  CaptureStderr();
  FlushInfoLog();
  local_170 = fork();
  do {
    bVar1 = IsTrue(local_170 != -1);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68,
                 (allocator<char> *)in_stack_fffffffffffffb60);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                     (char *)in_stack_fffffffffffffb30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                     (char *)in_stack_fffffffffffffb30);
      local_25c = 0x462;
      StreamableToString<int>((int *)streamable);
      std::operator+(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                     (char *)in_stack_fffffffffffffb30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                     (char *)in_stack_fffffffffffffb30);
      DeathTestAbort(in_stack_fffffffffffffb40);
    }
    bVar1 = AlwaysFalse();
  } while (bVar1);
  ForkingDeathTest::set_child_pid((ForkingDeathTest *)in_RDI,local_170);
  if (local_170 == 0) {
    do {
      do {
        local_260 = close(local_58);
        bVar1 = false;
        if (local_260 == -1) {
          piVar3 = __errno_location();
          bVar1 = *piVar3 == 4;
        }
      } while (bVar1);
      if (local_260 == -1) {
        message = local_341;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68,
                   (allocator<char> *)in_stack_fffffffffffffb60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                       (char *)in_stack_fffffffffffffb30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                       (char *)in_stack_fffffffffffffb30);
        StreamableToString<int>((int *)streamable);
        std::operator+(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                       (char *)in_stack_fffffffffffffb30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                       (char *)in_stack_fffffffffffffb30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                       (char *)in_stack_fffffffffffffb30);
        DeathTestAbort(message);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    DeathTestImpl::set_write_fd(in_RDI,local_54);
    LogToStderr();
    this_00 = GetUnitTestImpl();
    UnitTestImpl::listeners(this_00);
    TestEventListeners::SuppressEventForwarding
              (in_stack_fffffffffffffb30,(bool)in_stack_fffffffffffffb2f);
    g_in_fast_death_test_child = 1;
    local_4 = EXECUTE_TEST;
  }
  else {
    do {
      do {
        iVar2 = close(local_54);
        uVar4 = false;
        if (iVar2 == -1) {
          piVar3 = __errno_location();
          uVar4 = *piVar3 == 4;
        }
      } while ((bool)uVar4 != false);
      if (iVar2 == -1) {
        __rhs = &stack0xfffffffffffffbaf;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68,
                   (allocator<char> *)in_stack_fffffffffffffb60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar4,in_stack_fffffffffffffb38),__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar4,in_stack_fffffffffffffb38),__rhs);
        StreamableToString<int>((int *)streamable);
        std::operator+(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar4,in_stack_fffffffffffffb38),__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar4,in_stack_fffffffffffffb38),__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar4,in_stack_fffffffffffffb38),__rhs);
        DeathTestAbort(in_stack_fffffffffffffb40);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    DeathTestImpl::set_read_fd(in_RDI,local_58);
    DeathTestImpl::set_spawned(in_RDI,true);
    local_4 = OVERSEE_TEST;
  }
  return local_4;
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding(true);
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}